

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O2

string * __thiscall
Diligent::FormatString<char[30],char_const*,char[38],char_const*,char[110]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [30],char **Args_1,
          char (*Args_2) [38],char **Args_3,char (*Args_4) [110])

{
  stringstream ss;
  stringstream local_1b8 [392];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  FormatStrSS<std::__cxx11::stringstream,char[30],char_const*,char[38],char_const*,char[110]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
             (char (*) [30])this,(char **)Args,(char (*) [38])Args_1,(char **)Args_2,
             (char (*) [110])Args_3);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}